

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_class.h
# Opt level: O2

uint small_class_calc_offset_by_size(small_class *sc,uint size)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = 0;
  if (sc->size_shift_plus_1 <= size) {
    uVar4 = size - sc->size_shift_plus_1;
  }
  bVar1 = (byte)sc->effective_bits;
  uVar4 = uVar4 >> ((byte)sc->ignore_bits_count & 0x1f);
  uVar3 = uVar4 >> (bVar1 & 0x1f) | 1;
  iVar2 = 0x1f;
  if (uVar3 != 0) {
    for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
    }
  }
  return (iVar2 << (bVar1 & 0x1f)) + (uVar4 >> ((byte)iVar2 & 0x1f));
}

Assistant:

static inline unsigned
small_class_calc_offset_by_size(struct small_class *sc, unsigned size)
{
	/*
	 * Usually we have to decrement size in order to:
	 * 1)make zero base class.
	 * 2)round up to class size.
	 * Also here is a good place to shift size if a user wants the lowest
	 * class size to be different from granularity.
	 */
	unsigned checked_size = size - sc->size_shift_plus_1;
	/* Check overflow. */
	size = checked_size > size ? 0 : checked_size;
	/* Omit never significant bits. */
	size >>= sc->ignore_bits_count;
#ifndef SMALL_CLASS_BRANCHLESS
	if (size < sc->effective_size)
		return size; /* Linear approximation, faster part. */
	/* Get log2 base part of result. Effective bits are omitted. */
	unsigned log2 = small_class_fls(size >> sc->effective_bits);
#else
	/* Evaluation without branching */
	/*
	 * Get log2 base part of result. Effective bits are omitted.
	 * Also note that 1u is ORed to make log2 == 0 for smaller sizes.
	 */
	unsigned log2 = small_class_fls((size >> sc->effective_bits) | 1u);
#endif
	/* Effective bits (and leading 1?) in size, represent small steps. */
	unsigned linear_part = size >> log2;
	/* Log2 part, multiplied correspondingly, represent big steps. */
	unsigned log2_part = log2 << sc->effective_bits;
	/* Combine the result. */
	return linear_part + log2_part;
}